

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdftocsv.cpp
# Opt level: O2

void cdftocsv::doit(bool skipheader)

{
  bool bVar1;
  int iVar2;
  char *rec_;
  int iVar3;
  undefined7 in_register_00000039;
  ulong uVar4;
  int stream_type;
  vector<damagebindictionary,_std::allocator<damagebindictionary>_> damagebindictionary_vec;
  
  if ((int)CONCAT71(in_register_00000039,skipheader) == 0) {
    fwrite("event_id,areaperil_id,vulnerability_id,bin_index,prob_to,bin_mean\n",0x42,1,_stdout);
  }
  damagebindictionary_vec.
  super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  damagebindictionary_vec.
  super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  damagebindictionary_vec.
  super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getdamagebindictionary(&damagebindictionary_vec);
  iVar2 = (int)(((long)damagebindictionary_vec.
                       super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)damagebindictionary_vec.
                      super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x14) * 8 + 0x10;
  iVar3 = -1;
  if (-1 < iVar2) {
    iVar3 = iVar2;
  }
  uVar4 = 0x13890;
  if (damagebindictionary_vec.
      super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      damagebindictionary_vec.
      super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = (long)iVar3;
  }
  rec_ = (char *)operator_new__(uVar4);
  stream_type = 0;
  getrec((char *)&stream_type,_stdin,4);
  if (stream_type == 1) {
    while( true ) {
      bVar1 = getrec(rec_,_stdin,0xc);
      if (!bVar1) break;
      getrec(rec_ + 0xc,_stdin,4);
      getrec(rec_ + 0x10,_stdin,*(int *)(rec_ + 0xc) << 3);
      processrec(rec_);
    }
    std::_Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>::~_Vector_base
              (&damagebindictionary_vec.
                super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>);
    return;
  }
  fprintf(_stderr,"FATAL: Invalid stream type %d expect stream type 1\n");
  exit(-1);
}

Assistant:

void doit(bool skipheader)
	{

		if (skipheader == false) fprintf(stdout, "event_id,areaperil_id,vulnerability_id,bin_index,prob_to,bin_mean\n");
		std::vector<damagebindictionary> damagebindictionary_vec;
		getdamagebindictionary(damagebindictionary_vec);
		size_t total_bins = damagebindictionary_vec.size();
		if (total_bins == 0) total_bins = 10000;
		int max_recsize = (int)(total_bins * sizeof(prob_mean)) + sizeof(damagecdfrec) + sizeof(int);

		char *rec = new char[max_recsize];
		int stream_type = 0;

		bool bSuccess = getrec((char *)&stream_type, stdin, sizeof(stream_type));

		if (stream_type != 1) {
			fprintf(stderr, "FATAL: Invalid stream type %d expect stream type 1\n", stream_type);
			exit(-1);
		}
		for (;;) {
			char *p = rec;
			bSuccess = getrec(p, stdin, sizeof(damagecdfrec));
			if (bSuccess == false) break;
			p = p + sizeof(damagecdfrec);
			bSuccess = getrec(p, stdin, sizeof(int)); // we now have bin count
			int *q = (int *)p;
			p = p + sizeof(int);
			int recsize = (*q) * sizeof(prob_mean);
			// we should now have damagecdfrec in memory
			bSuccess = getrec(p, stdin, recsize);
			recsize += sizeof(damagecdfrec) + sizeof(int);

			processrec(rec);
		}
	}